

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

void memory_tree_ns::train_one_against_some_at_leaf
               (memory_tree *b,single_learner *base,uint32_t cn,example *ec)

{
  polylabel *ppVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  size_t sVar5;
  bool bVar6;
  size_t i;
  ulong uVar7;
  labels preds;
  v_array<unsigned_int> leaf_labs;
  labels multilabels;
  v_array<unsigned_int> local_78;
  v_array<unsigned_int> local_58;
  
  local_78.end_array = (uint *)0x0;
  local_78.erase_count = 0;
  local_78._begin = (uint *)0x0;
  local_78._end = (uint *)0x0;
  collect_labels_from_leaf(b,cn,&local_78);
  ppVar1 = &ec->l;
  local_58._begin = *(uint **)&(ec->l).multi;
  local_58._end = (uint *)(ec->l).cs.costs._end;
  local_58.end_array = (uint *)(ec->l).cs.costs.end_array;
  local_58.erase_count = (ec->l).cs.costs.erase_count;
  pfVar2 = (ec->pred).scalars._begin;
  pfVar3 = (ec->pred).scalars._end;
  pfVar4 = (ec->pred).scalars.end_array;
  sVar5 = (ec->pred).scalars.erase_count;
  *(undefined8 *)((long)&(ec->l).cs.costs._begin + 4) = 0x3f800000;
  for (uVar7 = 0; uVar7 < (ulong)((long)local_78._end - (long)local_78._begin >> 2);
      uVar7 = uVar7 + 1) {
    (ppVar1->multi).label = 0xbf800000;
    bVar6 = v_array_contains<unsigned_int>(&local_58,local_78._begin[uVar7]);
    if (bVar6) {
      (ppVar1->multi).label = 0x3f800000;
    }
    LEARNER::learner<char,_example>::learn
              (base,ec,b->max_routers + (ulong)local_78._begin[uVar7] + 1);
  }
  (ec->pred).scalars.end_array = pfVar4;
  (ec->pred).scalars.erase_count = sVar5;
  (ec->pred).scalars._begin = pfVar2;
  (ec->pred).scalars._end = pfVar3;
  (ec->l).cs.costs.end_array = (wclass *)local_58.end_array;
  (ec->l).cs.costs.erase_count = local_58.erase_count;
  ppVar1->multi = (label_t)local_58._begin;
  (ec->l).cs.costs._end = (wclass *)local_58._end;
  return;
}

Assistant:

inline void train_one_against_some_at_leaf(memory_tree& b, single_learner& base, const uint32_t cn, example& ec){
        v_array<uint32_t> leaf_labs = v_init<uint32_t>();
        collect_labels_from_leaf(b, cn, leaf_labs); //unique labels from the leaf.
        MULTILABEL::labels multilabels = ec.l.multilabels;
        MULTILABEL::labels preds = ec.pred.multilabels;
        ec.l.simple = {FLT_MAX, 1.f, 0.f};
        for (size_t i = 0; i < leaf_labs.size(); i++){
            ec.l.simple.label = -1.f;
            if (v_array_contains(multilabels.label_v, leaf_labs[i]))
                ec.l.simple.label = 1.f;
            base.learn(ec, b.max_routers + 1 + leaf_labs[i]);
        }
        ec.pred.multilabels = preds;
        ec.l.multilabels = multilabels;
    }